

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double dVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double rentry;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar1 = *rdata;
      iVar4 = 0;
      do {
        result_data[iVar4] = ldata[iVar4] * dVar1;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar6 = 0;
    do {
      uVar3 = puVar2[uVar8];
      uVar5 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar5 = count;
      }
      uVar7 = uVar5;
      if (uVar3 != 0) {
        uVar7 = uVar6;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar6 < uVar5) {
            dVar1 = *rdata;
            do {
              result_data[uVar7] = ldata[uVar7] * dVar1;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
        }
        else if (uVar6 < uVar5) {
          uVar7 = 0;
          do {
            if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
              result_data[uVar6 + uVar7] = ldata[uVar6 + uVar7] * *rdata;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar6 - uVar5) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      uVar8 = uVar8 + 1;
      uVar6 = uVar7;
    } while (uVar8 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}